

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_codecvt.h
# Opt level: O0

result __thiscall
booster::locale::generic_codecvt<wchar_t,_booster::locale::util::simple_codecvt<wchar_t>,_4>::do_out
          (generic_codecvt<wchar_t,_booster::locale::util::simple_codecvt<wchar_t>,_4> *this,
          mbstate_t *param_2,uchar *from,uchar *from_end,uchar **from_next,char *to,char *to_end,
          char **to_next)

{
  uint uVar1;
  bool bVar2;
  code_point *in_RCX;
  code_point *in_RDX;
  state_type *in_RDI;
  undefined8 *in_R8;
  ulong in_R9;
  ulong in_stack_00000008;
  ulong *in_stack_00000010;
  uint32_t len;
  uint32_t ch;
  state_type cvt_state;
  result r;
  char *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb4;
  code_point in_stack_ffffffffffffffc0;
  code_point v;
  result local_34;
  ulong local_30;
  code_point *local_18;
  
  local_34 = ok;
  implementation((generic_codecvt<wchar_t,_booster::locale::util::simple_codecvt<wchar_t>,_4> *)
                 in_RDI);
  util::simple_codecvt<wchar_t>::initial_state(from_unicode_state);
  local_30 = in_R9;
  local_18 = in_RDX;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffb4 & 0xffffff;
    if (local_30 < in_stack_00000008) {
      uVar1 = CONCAT13(local_18 < in_RCX,(int3)in_stack_ffffffffffffffb4);
    }
    in_stack_ffffffffffffffb4 = uVar1;
    if ((char)(in_stack_ffffffffffffffb4 >> 0x18) == '\0') goto LAB_00259d9a;
    v = *local_18;
    bVar2 = utf::is_valid_codepoint(v);
    if (!bVar2) {
      local_34 = error;
      goto LAB_00259d9a;
    }
    implementation((generic_codecvt<wchar_t,_booster::locale::util::simple_codecvt<wchar_t>,_4> *)
                   in_RDI);
    in_stack_ffffffffffffffc0 =
         util::simple_codecvt<wchar_t>::from_unicode
                   ((simple_codecvt<wchar_t> *)CONCAT44(v,in_stack_ffffffffffffffc0),in_RDI,
                    in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,(char *)0x259d4c);
    if (in_stack_ffffffffffffffc0 == 0xfffffffe) {
      local_34 = partial;
      goto LAB_00259d9a;
    }
    if (in_stack_ffffffffffffffc0 == 0xffffffff) break;
    local_30 = local_30 + in_stack_ffffffffffffffc0;
    local_18 = local_18 + 1;
  }
  local_34 = error;
LAB_00259d9a:
  *in_R8 = local_18;
  *in_stack_00000010 = local_30;
  if ((local_34 == ok) && (local_18 != in_RCX)) {
    local_34 = partial;
  }
  return local_34;
}

Assistant:

virtual std::codecvt_base::result 
    do_out( std::mbstate_t &/*std_state*/,
            uchar const *from,
            uchar const *from_end,
            uchar const *&from_next,
            char *to,
            char *to_end,
            char *&to_next) const
    {
        std::codecvt_base::result r=std::codecvt_base::ok;
        typedef typename CodecvtImpl::state_type state_type;
        state_type cvt_state = implementation().initial_state(generic_codecvt_base::from_unicode_state);
        while(to < to_end && from < from_end)
        {
#ifdef DEBUG_CODECVT            
        std::cout << "Entering OUT --------------" << std::endl;
        std::cout << "State " << std::hex << state <<std::endl;
        std::cout << "Left in " << std::dec << from_end - from << " out " << to_end -to << std::endl;
#endif            
            booster::uint32_t ch=0;
            ch = *from;
            if(!booster::locale::utf::is_valid_codepoint(ch)) {
                r=std::codecvt_base::error;
                break;
            }
            booster::uint32_t len = implementation().from_unicode(cvt_state,ch,to,to_end);
            if(len == booster::locale::utf::incomplete) {
                r=std::codecvt_base::partial;
                break;
            }
            else if(len == booster::locale::utf::illegal) {
                r=std::codecvt_base::error;
                break;
            }
            to+=len;
            from++;
        }
        from_next=from;
        to_next=to;
        if(r==std::codecvt_base::ok && from!=from_end)
            r = std::codecvt_base::partial;
#ifdef DEBUG_CODECVT            
        std::cout << "Returning ";
        switch(r) {
        case std::codecvt_base::ok:
            std::cout << "ok" << std::endl;
            break;
        case std::codecvt_base::partial:
            std::cout << "partial" << std::endl;
            break;
        case std::codecvt_base::error:
            std::cout << "error" << std::endl;
            break;
        default:
            std::cout << "other" << std::endl;
            break;
        }
        std::cout << "State " << std::hex << state <<std::endl;
        std::cout << "Left in " << std::dec << from_end - from << " out " << to_end -to << std::endl;
#endif            
        return r;
    }